

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,StringRef _className,NameAndTags *_nameAndTags,
          SourceLineInfo *_lineInfo)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  NameAndTags *pNVar7;
  TestCaseInfo *pTVar8;
  bool bVar9;
  TestCaseProperties TVar10;
  int iVar11;
  char *pcVar12;
  ostream *poVar13;
  __normal_iterator<Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_> __first;
  ReusableStringStream *pRVar14;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type sVar15;
  ulong uVar16;
  ulong uVar17;
  anon_unknown_26 *paVar18;
  ostream *poVar19;
  StringRef filename;
  StringRef tag;
  StringRef tag_00;
  StringRef tagStr;
  StringRef tagStr_00;
  ReusableStringStream local_c8;
  NameAndTags *local_b0;
  SourceLineInfo *local_a8;
  TestCaseInfo *local_a0;
  string local_98;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *local_78;
  SourceLineInfo *local_70;
  string *local_68;
  ReusableStringStream local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar15 = (_nameAndTags->name).m_size;
  local_b0 = _nameAndTags;
  if (sVar15 == 0) {
    (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter =
         (anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter + 1;
    std::__cxx11::to_string(&local_98,(anonymous_namespace)::makeDefaultName[abi:cxx11]()::counter);
    std::operator+(&local_50,"Anonymous test case ",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    local_c8.m_index = (size_t)local_50._M_dataplus._M_p;
    local_c8.m_oss = (ostream *)local_50._M_string_length;
  }
  else {
    local_c8.m_index = (size_t)(_nameAndTags->name).m_start;
    local_c8.m_oss = (ostream *)(_nameAndTags->name).m_size;
  }
  pNVar7 = local_b0;
  StringRef::operator_cast_to_string(&this->name,(StringRef *)&local_c8);
  if (sVar15 == 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  (this->className).m_start = _className.m_start;
  (this->className).m_size = _className.m_size;
  (this->backingTags)._M_dataplus._M_p = (pointer)&(this->backingTags).field_2;
  (this->backingTags)._M_string_length = 0;
  (this->backingTags).field_2._M_local_buf[0] = '\0';
  local_78 = &this->tags;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar5 = _lineInfo->line;
  (this->lineInfo).file = _lineInfo->file;
  (this->lineInfo).line = sVar5;
  this->properties = None;
  pcVar3 = (pNVar7->tags).m_start;
  uVar4 = (pNVar7->tags).m_size;
  paVar18 = (anon_unknown_26 *)_lineInfo->file;
  local_a8 = _lineInfo;
  pcVar12 = (char *)strlen((char *)paVar18);
  filename.m_size = extraout_RDX;
  filename.m_start = pcVar12;
  anon_unknown_26::extractFilenamePart(paVar18,filename);
  local_a0 = this;
  local_68 = &this->backingTags;
  std::__cxx11::string::reserve((ulong)&this->backingTags);
  local_70 = &this->lineInfo;
  uVar17 = 0;
  bVar6 = false;
  uVar16 = 0;
  sVar15 = extraout_RDX_00;
  do {
    pTVar8 = local_a0;
    if (uVar4 == uVar17) {
      if (!bVar6) {
        if ((local_a0->properties & IsHidden) != None) {
          tagStr_00.m_size = 1;
          tagStr_00.m_start = ".";
          internalAppendTag(local_a0,tagStr_00);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((pTVar8->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (pTVar8->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<Catch::Tag*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            ((pTVar8->tags).
                             super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (pTVar8->tags).
                             super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                             super__Vector_impl_data._M_finish);
        std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::erase
                  (local_78,(const_iterator)__first._M_current,
                   (pTVar8->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        return;
      }
      ReusableStringStream::ReusableStringStream(&local_c8);
      std::operator<<(local_c8.m_oss,"Found an unclosed tag while registering test case \'");
      pRVar14 = ReusableStringStream::operator<<(&local_c8,&local_b0->name);
      pRVar14 = ReusableStringStream::operator<<(pRVar14,(char (*) [6])"\' at ");
      pRVar14 = ReusableStringStream::operator<<(pRVar14,local_a8);
      ReusableStringStream::str_abi_cxx11_(&local_98,pRVar14);
      throw_domain_error(&local_98);
    }
    cVar2 = pcVar3[uVar17];
    if (cVar2 == ']') {
      if (!bVar6) {
        ReusableStringStream::ReusableStringStream(&local_c8);
        std::operator<<(local_c8.m_oss,"Found unmatched \']\' while registering test case \'");
        pRVar14 = ReusableStringStream::operator<<(&local_c8,&local_b0->name);
        pRVar14 = ReusableStringStream::operator<<(pRVar14,(char (*) [6])"\' at ");
        pRVar14 = ReusableStringStream::operator<<(pRVar14,local_a8);
        ReusableStringStream::str_abi_cxx11_(&local_98,pRVar14);
        throw_domain_error(&local_98);
      }
      uVar1 = uVar16 + 1;
      poVar13 = (ostream *)(uVar4 - uVar1);
      if (uVar4 < uVar1 || poVar13 == (ostream *)0x0) {
LAB_00136b76:
        ReusableStringStream::ReusableStringStream(&local_c8);
        std::operator<<(local_c8.m_oss,"Found an empty tag while registering test case \'");
        pRVar14 = ReusableStringStream::operator<<(&local_c8,&local_b0->name);
        pRVar14 = ReusableStringStream::operator<<(pRVar14,(char (*) [6])"\' at ");
        pRVar14 = ReusableStringStream::operator<<(pRVar14,local_a8);
        ReusableStringStream::str_abi_cxx11_(&local_98,pRVar14);
        throw_domain_error(&local_98);
      }
      poVar19 = (ostream *)(~uVar16 + uVar17);
      if (poVar13 < (ostream *)(~uVar16 + uVar17)) {
        poVar19 = poVar13;
      }
      if (poVar19 == (ostream *)0x0) goto LAB_00136b76;
      paVar18 = (anon_unknown_26 *)(pcVar3 + uVar1);
      tag.m_size = sVar15;
      tag.m_start = (char *)poVar19;
      local_c8.m_index = (size_t)paVar18;
      local_c8.m_oss = poVar19;
      TVar10 = anon_unknown_26::parseSpecialTag(paVar18,tag);
      sVar15 = extraout_RDX_01;
      if (TVar10 == None) {
        iVar11 = isalnum((uint)(byte)*paVar18);
        sVar15 = extraout_RDX_02;
        if (iVar11 == 0) {
          ReusableStringStream::ReusableStringStream(&local_60);
          std::operator<<(local_60.m_oss,"Tag name: [");
          pRVar14 = ReusableStringStream::operator<<(&local_60,(StringRef *)&local_c8);
          pRVar14 = ReusableStringStream::operator<<(pRVar14,(char (*) [19])"] is not allowed.\n");
          pRVar14 = ReusableStringStream::operator<<
                              (pRVar14,(char (*) [66])
                                       "Tag names starting with non alphanumeric characters are reserved\n"
                              );
          pRVar14 = ReusableStringStream::operator<<(pRVar14,local_70);
          ReusableStringStream::str_abi_cxx11_(&local_98,pRVar14);
          throw_domain_error(&local_98);
        }
      }
      tag_00.m_size = sVar15;
      tag_00.m_start = (char *)poVar19;
      TVar10 = anon_unknown_26::parseSpecialTag(paVar18,tag_00);
      local_a0->properties = local_a0->properties | TVar10;
      if (poVar19 == (ostream *)0x1) {
        poVar19 = (ostream *)0x1;
      }
      else if (*paVar18 == (anon_unknown_26)0x2e) {
        poVar19 = poVar19 + -1;
        paVar18 = paVar18 + 1;
      }
      tagStr.m_size = (size_type)poVar19;
      tagStr.m_start = (char *)paVar18;
      internalAppendTag(local_a0,tagStr);
      sVar15 = extraout_RDX_03;
      bVar9 = false;
    }
    else {
      bVar9 = bVar6;
      if ((cVar2 == '[') && (uVar16 = uVar17, bVar9 = true, bVar6)) {
        ReusableStringStream::ReusableStringStream(&local_c8);
        std::operator<<(local_c8.m_oss,"Found \'[\' inside a tag while registering test case \'");
        pRVar14 = ReusableStringStream::operator<<(&local_c8,&local_b0->name);
        pRVar14 = ReusableStringStream::operator<<(pRVar14,(char (*) [6])"\' at ");
        pRVar14 = ReusableStringStream::operator<<(pRVar14,local_a8);
        ReusableStringStream::str_abi_cxx11_(&local_98,pRVar14);
        throw_domain_error(&local_98);
      }
    }
    bVar6 = bVar9;
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

TestCaseInfo::TestCaseInfo(StringRef _className,
                               NameAndTags const& _nameAndTags,
                               SourceLineInfo const& _lineInfo):
        name( _nameAndTags.name.empty() ? makeDefaultName() : _nameAndTags.name ),
        className( _className ),
        lineInfo( _lineInfo )
    {
        StringRef originalTags = _nameAndTags.tags;
        // We need to reserve enough space to store all of the tags
        // (including optional hidden tag and filename tag)
        auto requiredSize = originalTags.size() + sizeOfExtraTags(_lineInfo.file);
        backingTags.reserve(requiredSize);

        // We cannot copy the tags directly, as we need to normalize
        // some tags, so that [.foo] is copied as [.][foo].
        size_t tagStart = 0;
        size_t tagEnd = 0;
        bool inTag = false;
        for (size_t idx = 0; idx < originalTags.size(); ++idx) {
            auto c = originalTags[idx];
            if (c == '[') {
                CATCH_ENFORCE(
                    !inTag,
                    "Found '[' inside a tag while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = true;
                tagStart = idx;
            }
            if (c == ']') {
                CATCH_ENFORCE(
                    inTag,
                    "Found unmatched ']' while registering test case '"
                        << _nameAndTags.name << "' at " << _lineInfo );

                inTag = false;
                tagEnd = idx;
                assert(tagStart < tagEnd);

                // We need to check the tag for special meanings, copy
                // it over to backing storage and actually reference the
                // backing storage in the saved tags
                StringRef tagStr = originalTags.substr(tagStart+1, tagEnd - tagStart - 1);
                CATCH_ENFORCE( !tagStr.empty(),
                               "Found an empty tag while registering test case '"
                                   << _nameAndTags.name << "' at "
                                   << _lineInfo );

                enforceNotReservedTag(tagStr, lineInfo);
                properties |= parseSpecialTag(tagStr);
                // When copying a tag to the backing storage, we need to
                // check if it is a merged hide tag, such as [.foo], and
                // if it is, we need to handle it as if it was [foo].
                if (tagStr.size() > 1 && tagStr[0] == '.') {
                    tagStr = tagStr.substr(1, tagStr.size() - 1);
                }
                // We skip over dealing with the [.] tag, as we will add
                // it later unconditionally and then sort and unique all
                // the tags.
                internalAppendTag(tagStr);
            }
        }
        CATCH_ENFORCE( !inTag,
                       "Found an unclosed tag while registering test case '"
                           << _nameAndTags.name << "' at " << _lineInfo );


        // Add [.] if relevant
        if (isHidden()) {
            internalAppendTag("."_sr);
        }

        // Sort and prepare tags
        std::sort(begin(tags), end(tags));
        tags.erase(std::unique(begin(tags), end(tags)),
                   end(tags));
    }